

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O2

hash_t __thiscall duckdb::Hash<duckdb::interval_t>(duckdb *this,interval_t val)

{
  hash_t hVar1;
  hash_t hVar2;
  hash_t hVar3;
  long lVar4;
  
  lVar4 = ((long)this >> 0x20) + val._0_8_ / 86400000000;
  hVar1 = MurmurHash64(lVar4 % 0x1e);
  hVar2 = MurmurHash64((long)(int)this + lVar4 / 0x1e);
  hVar3 = MurmurHash64(val._0_8_ % 86400000000);
  return hVar3 ^ hVar2 ^ hVar1;
}

Assistant:

hash_t Hash(interval_t val) {
	int64_t months, days, micros;
	val.Normalize(months, days, micros);
	return Hash(days) ^ Hash(months) ^ Hash(micros);
}